

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialnonce.cpp
# Opt level: O3

void __thiscall
ConfidentialNonce_Constractor_bytedata32_Test::~ConfidentialNonce_Constractor_bytedata32_Test
          (ConfidentialNonce_Constractor_bytedata32_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ConfidentialNonce, Constractor_bytedata32) {
  ByteData bytedata(
      "186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  ConfidentialNonce nonce(bytedata);
  EXPECT_STREQ(
      nonce.GetHex().c_str(),
      "01186c7f955149a5274b39e24b6a50d1d6479f552f6522d91f3a97d771f1c18179");
  EXPECT_EQ(nonce.GetData().GetDataSize(), 33);
  EXPECT_EQ(nonce.HasBlinding(), false);
}